

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortFactory.cpp
# Opt level: O1

BasePort * PortFactory(char *args,ostream *debugStream)

{
  bool bVar1;
  EthUdpPort *this;
  size_t sVar2;
  bool fwBridge;
  int portNumber;
  PortType portType;
  string IPaddr;
  bool local_41;
  int local_40;
  PortType local_3c;
  string local_38;
  
  local_40 = 0;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"169.254.0.100","");
  local_41 = false;
  local_3c = BasePort::DefaultPortType();
  bVar1 = BasePort::ParseOptions(args,&local_3c,&local_40,&local_38,&local_41,(ostream *)&std::cerr)
  ;
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (debugStream,"PortFactory: Failed to parse option: ",0x25);
    if (args != (char *)0x0) {
      sVar2 = strlen(args);
      goto LAB_001114f4;
    }
    std::ios::clear((int)debugStream + (int)*(undefined8 *)(*(long *)debugStream + -0x18));
    goto LAB_001114ff;
  }
  switch(local_3c) {
  case PORT_FIREWIRE:
    this = (EthUdpPort *)operator_new(0x4f8);
    FirewirePort::FirewirePort((FirewirePort *)this,local_40,debugStream);
    goto LAB_00111529;
  case PORT_ETH_UDP:
    this = (EthUdpPort *)operator_new(0x570);
    EthUdpPort::EthUdpPort(this,local_40,&local_38,local_41,debugStream,(EthCallbackType)0x0);
    goto LAB_00111529;
  case PORT_ETH_RAW:
    sVar2 = 0x47;
    args = "PortFactory: Raw Ethernet not available (set Amp1394_HAS_PCAP in CMake)";
    break;
  case PORT_ZYNQ_EMIO:
    sVar2 = 0x24;
    args = "PortFactory: Zynq EMIO not available";
    break;
  default:
    sVar2 = 0x22;
    args = "PortFactory: Unsupported port type";
  }
LAB_001114f4:
  std::__ostream_insert<char,std::char_traits<char>>(debugStream,args,sVar2);
LAB_001114ff:
  std::ios::widen((char)*(undefined8 *)(*(long *)debugStream + -0x18) + (char)debugStream);
  std::ostream::put((char)debugStream);
  std::ostream::flush();
  this = (EthUdpPort *)0x0;
LAB_00111529:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return (BasePort *)this;
}

Assistant:

BasePort * PortFactory(const char * args, std::ostream & debugStream)
{
    BasePort * port = 0;
    int portNumber = 0;
    std::string IPaddr = ETH_UDP_DEFAULT_IP;
    bool fwBridge = false;

    BasePort::PortType portType = BasePort::DefaultPortType();

    if (!BasePort::ParseOptions(args, portType, portNumber, IPaddr, fwBridge)) {
        debugStream << "PortFactory: Failed to parse option: " << args << std::endl;
        return port;
    }

    switch (portType) {

    case BasePort::PORT_FIREWIRE:
#if Amp1394_HAS_RAW1394
        port = new FirewirePort(portNumber, debugStream);
#else
        debugStream << "PortFactory: FireWire not available (set Amp1394_HAS_RAW1394 in CMake)" << std::endl;
#endif
        break;

    case BasePort::PORT_ETH_UDP:
        port = new EthUdpPort(portNumber, IPaddr, fwBridge, debugStream);
        break;
    
    case BasePort::PORT_ETH_RAW:
#if Amp1394_HAS_PCAP
        port = new EthRawPort(portNumber, fwBridge, debugStream);
#else
        debugStream << "PortFactory: Raw Ethernet not available (set Amp1394_HAS_PCAP in CMake)" << std::endl;
#endif
        break;

    case BasePort::PORT_ZYNQ_EMIO:
#if Amp1394_HAS_EMIO
        port = new ZynqEmioPort(portNumber, debugStream);
#else
        debugStream << "PortFactory: Zynq EMIO not available" << std::endl;
#endif
        break;

    default:
        debugStream << "PortFactory: Unsupported port type" << std::endl;
        break;
    }
    
    return port;
}